

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS ref_search_tec(REF_SEARCH ref_search,char *filename)

{
  ulong uVar1;
  REF_DBL *pRVar2;
  REF_STATUS RVar3;
  FILE *__s;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x2b5,
           "ref_search_tec","unable to open file");
    RVar3 = 2;
  }
  else if (ref_search->d == 3) {
    fwrite("title=\"tecplot refine search\"\n",0x1e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"r\" \"i\"\n",0x20,1,__s);
    fprintf(__s,"zone t=\"tree\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uint)ref_search->n,(ulong)(uint)(ref_search->n * 2),"point","felineseg");
    for (lVar7 = 0; uVar4 = (ulong)ref_search->n, lVar7 < (long)uVar4; lVar7 = lVar7 + 1) {
      pRVar2 = ref_search->pos;
      lVar6 = (long)(int)lVar7 * (long)ref_search->d;
      fprintf(__s," %f %f %f %f %d\n",pRVar2[lVar6],pRVar2[lVar6 + 1],pRVar2[lVar6 + 2],
              ref_search->radius[lVar7],(ulong)(uint)ref_search->item[lVar7]);
    }
    uVar8 = 0;
    while ((long)uVar8 < (long)(int)uVar4) {
      iVar5 = (int)uVar8;
      if (ref_search->right[uVar8] != -1) {
        iVar5 = ref_search->right[uVar8];
      }
      uVar1 = uVar8 + 1;
      fprintf(__s," %d %d\n",uVar1 & 0xffffffff,(ulong)(iVar5 + 1));
      iVar5 = (int)uVar1 + -1;
      if (ref_search->left[uVar8] != -1) {
        iVar5 = ref_search->left[uVar8];
      }
      fprintf(__s," %d %d\n",uVar1 & 0xffffffff,(ulong)(iVar5 + 1));
      uVar8 = uVar1;
      uVar4 = (ulong)(uint)ref_search->n;
    }
    fclose(__s);
    RVar3 = 0;
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x2b7,
           "ref_search_tec","limited to 3D");
    RVar3 = 1;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_search_tec(REF_SEARCH ref_search, const char *filename) {
  FILE *f;
  const char *zonetype = "felineseg";
  REF_INT i;
  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  RAS(3 == ref_search->d, "limited to 3D");

  fprintf(f, "title=\"tecplot refine search\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"r\" \"i\"\n");

  fprintf(f,
          "zone t=\"tree\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          ref_search->n, 2 * (ref_search->n), "point", zonetype);

  for (i = 0; i < ref_search->n; i++) {
    fprintf(f, " %f %f %f %f %d\n", ref_search->pos[0 + ref_search->d * i],
            ref_search->pos[1 + ref_search->d * i],
            ref_search->pos[2 + ref_search->d * i], ref_search->radius[i],
            ref_search->item[i]);
  }

  for (i = 0; i < ref_search->n; i++) {
    REF_INT j;
    j = ref_search->right[i];
    if (REF_EMPTY == j) j = i;
    fprintf(f, " %d %d\n", i + 1, j + 1);
    j = ref_search->left[i];
    if (REF_EMPTY == j) j = i;
    fprintf(f, " %d %d\n", i + 1, j + 1);
  }

  fclose(f);
  return REF_SUCCESS;
}